

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

cram_container * cram_read_container(cram_fd *fd)

{
  int32_t *piVar1;
  bool bVar2;
  byte bVar3;
  byte bVar13;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  cram_container *c;
  int32_t *piVar10;
  int *piVar11;
  byte bVar14;
  ulong uVar12;
  byte bVar15;
  byte *pbVar16;
  long lVar17;
  size_t sVar18;
  long lVar19;
  int32_t i32;
  int local_284;
  int32_t local_280;
  int32_t local_27c;
  int32_t local_278;
  int32_t local_274;
  int64_t local_270 [2];
  int32_t local_260;
  int32_t local_25c;
  int32_t local_258 [138];
  
  fd->err = 0;
  fd->eof = 0;
  memset(&local_280,0,0x250);
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar4 = itf8_decode(fd,&local_280);
    if (iVar4 == -1) {
      fd->eof = (fd->empty_container == 0) + 1;
      return (cram_container *)0x0;
    }
  }
  else {
    iVar4 = int32_decode(fd,&local_280);
    if (iVar4 == -1) {
      iVar4 = 1;
      if (fd->version != 0x200) {
        iVar4 = (fd->empty_container == 0) + 1;
      }
      fd->eof = iVar4;
      return (cram_container *)0x0;
    }
  }
  uVar5 = itf8_decode(fd,&local_27c);
  if (uVar5 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  uVar6 = itf8_decode(fd,&local_278);
  if (uVar6 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  uVar7 = itf8_decode(fd,&local_274);
  if (uVar7 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  uVar8 = itf8_decode(fd,&local_260);
  if (uVar8 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  lVar17 = (ulong)uVar8 + (ulong)uVar7 + (ulong)uVar6 + (ulong)uVar5 + (long)iVar4;
  iVar4 = fd->version >> 8;
  if (iVar4 == 1) {
    local_270[0] = 0;
    local_270[1] = 0;
  }
  else {
    if (iVar4 < 3) {
      uVar5 = itf8_decode(fd,&local_284);
      if (uVar5 == 0xffffffff) {
        return (cram_container *)0x0;
      }
      local_270[0] = (int64_t)local_284;
    }
    else {
      uVar5 = ltf8_decode(fd,local_270);
      if (uVar5 == 0xffffffff) {
        return (cram_container *)0x0;
      }
    }
    uVar6 = ltf8_decode(fd,local_270 + 1);
    if (uVar6 == 0xffffffff) {
      return (cram_container *)0x0;
    }
    lVar17 = lVar17 + (ulong)uVar5 + (ulong)uVar6;
  }
  uVar5 = itf8_decode(fd,&local_25c);
  if (uVar5 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  uVar6 = itf8_decode(fd,local_258);
  if (uVar6 == 0xffffffff) {
    return (cram_container *)0x0;
  }
  c = (cram_container *)calloc(1,0x250);
  if (c == (cram_container *)0x0) {
    return (cram_container *)0x0;
  }
  memcpy(c,&local_280,0x250);
  iVar4 = c->num_landmarks;
  piVar10 = (int32_t *)malloc((long)iVar4 << 2);
  c->landmark = piVar10;
  if ((long)iVar4 != 0 && piVar10 == (int32_t *)0x0) {
    piVar11 = __errno_location();
    fd->err = *piVar11;
LAB_0012a5d8:
    cram_free_container(c);
    return (cram_container *)0x0;
  }
  sVar18 = lVar17 + (ulong)uVar6 + (ulong)uVar5;
  iVar4 = c->num_landmarks;
  if (0 < iVar4) {
    lVar19 = 0;
    lVar17 = 0;
    do {
      uVar5 = itf8_decode(fd,(int32_t *)((long)c->landmark + lVar19));
      if (uVar5 == 0xffffffff) goto LAB_0012a5d8;
      sVar18 = sVar18 + uVar5;
      lVar17 = lVar17 + 1;
      iVar4 = c->num_landmarks;
      lVar19 = lVar19 + 4;
    } while (lVar17 < iVar4);
  }
  if (fd->version < 0x300) goto LAB_0012ab85;
  piVar10 = (int32_t *)malloc((long)(iVar4 * 5 + 0x32));
  if (piVar10 == (int32_t *)0x0) {
    cram_free_container(c);
LAB_0012a5ed:
    bVar2 = false;
  }
  else {
    iVar4 = int32_decode(fd,(int32_t *)&c->crc32);
    if (iVar4 == -1) goto LAB_0012a5ed;
    *piVar10 = c->length;
    uVar5 = c->ref_seq_id;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *(byte *)(piVar10 + 1) = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *(byte *)(piVar10 + 1) = bVar13 | 0x80;
        *(byte *)((long)piVar10 + 5) = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *(byte *)(piVar10 + 1) = bVar14 | 0xc0;
          *(byte *)((long)piVar10 + 5) = bVar13;
          *(byte *)((long)piVar10 + 6) = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *(byte *)(piVar10 + 1) = bVar15 | 0xe0;
            *(byte *)((long)piVar10 + 5) = bVar14;
            *(byte *)((long)piVar10 + 6) = bVar13;
            *(byte *)((long)piVar10 + 7) = bVar3;
            lVar17 = 4;
          }
          else {
            *(byte *)(piVar10 + 1) = bVar15 >> 4 | 0xf0;
            *(char *)((long)piVar10 + 5) = (char)(uVar5 >> 0x14);
            *(char *)((long)piVar10 + 6) = (char)(uVar5 >> 0xc);
            *(char *)((long)piVar10 + 7) = (char)(uVar5 >> 4);
            *(byte *)(piVar10 + 2) = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    pbVar16 = (byte *)((long)(piVar10 + 1) + lVar17);
    uVar5 = c->ref_seq_start;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar16 = bVar13 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar16 = bVar14 | 0xc0;
          pbVar16[1] = bVar13;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar15 | 0xe0;
            pbVar16[1] = bVar14;
            pbVar16[2] = bVar13;
            pbVar16[3] = bVar3;
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar15 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar5 >> 0x14);
            pbVar16[2] = (byte)(uVar5 >> 0xc);
            pbVar16[3] = (byte)(uVar5 >> 4);
            pbVar16[4] = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    pbVar16 = pbVar16 + lVar17;
    uVar5 = c->ref_seq_span;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar16 = bVar13 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar16 = bVar14 | 0xc0;
          pbVar16[1] = bVar13;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar15 | 0xe0;
            pbVar16[1] = bVar14;
            pbVar16[2] = bVar13;
            pbVar16[3] = bVar3;
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar15 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar5 >> 0x14);
            pbVar16[2] = (byte)(uVar5 >> 0xc);
            pbVar16[3] = (byte)(uVar5 >> 4);
            pbVar16[4] = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    pbVar16 = pbVar16 + lVar17;
    uVar5 = c->num_records;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar16 = bVar13 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar16 = bVar14 | 0xc0;
          pbVar16[1] = bVar13;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar15 | 0xe0;
            pbVar16[1] = bVar14;
            pbVar16[2] = bVar13;
            pbVar16[3] = bVar3;
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar15 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar5 >> 0x14);
            pbVar16[2] = (byte)(uVar5 >> 0xc);
            pbVar16[3] = (byte)(uVar5 >> 4);
            pbVar16[4] = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    uVar5 = ltf8_put((char *)(pbVar16 + lVar17),c->record_counter);
    pbVar16 = pbVar16 + lVar17 + uVar5;
    uVar12 = c->num_bases;
    bVar3 = (byte)uVar12;
    if (uVar12 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar12 >> 0x18);
      bVar14 = (byte)(uVar12 >> 8);
      if (uVar12 < 0x4000) {
        *pbVar16 = bVar14 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar15 = (byte)(uVar12 >> 0x10);
        if (uVar12 < 0x200000) {
          *pbVar16 = bVar15 | 0xc0;
          pbVar16[1] = bVar14;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else if (uVar12 < 0x10000000) {
          *pbVar16 = bVar13 | 0xe0;
          pbVar16[1] = bVar15;
          pbVar16[2] = bVar14;
          pbVar16[3] = bVar3;
          lVar17 = 4;
        }
        else {
          *pbVar16 = bVar13 >> 4 | 0xf0;
          pbVar16[1] = (byte)(uVar12 >> 0x14);
          pbVar16[2] = (byte)(uVar12 >> 0xc);
          pbVar16[3] = (byte)(uVar12 >> 4);
          pbVar16[4] = bVar3 & 0xf;
          lVar17 = 5;
        }
      }
    }
    pbVar16 = pbVar16 + lVar17;
    uVar5 = c->num_blocks;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar16 = bVar13 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar16 = bVar14 | 0xc0;
          pbVar16[1] = bVar13;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar15 | 0xe0;
            pbVar16[1] = bVar14;
            pbVar16[2] = bVar13;
            pbVar16[3] = bVar3;
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar15 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar5 >> 0x14);
            pbVar16[2] = (byte)(uVar5 >> 0xc);
            pbVar16[3] = (byte)(uVar5 >> 4);
            pbVar16[4] = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    pbVar16 = pbVar16 + lVar17;
    uVar5 = c->num_landmarks;
    bVar3 = (byte)uVar5;
    if (uVar5 < 0x80) {
      *pbVar16 = bVar3;
      lVar17 = 1;
    }
    else {
      bVar13 = (byte)(uVar5 >> 8);
      if (uVar5 < 0x4000) {
        *pbVar16 = bVar13 | 0x80;
        pbVar16[1] = bVar3;
        lVar17 = 2;
      }
      else {
        bVar14 = (byte)(uVar5 >> 0x10);
        if (uVar5 < 0x200000) {
          *pbVar16 = bVar14 | 0xc0;
          pbVar16[1] = bVar13;
          pbVar16[2] = bVar3;
          lVar17 = 3;
        }
        else {
          bVar15 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar15 | 0xe0;
            pbVar16[1] = bVar14;
            pbVar16[2] = bVar13;
            pbVar16[3] = bVar3;
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar15 >> 4 | 0xf0;
            pbVar16[1] = (byte)(uVar5 >> 0x14);
            pbVar16[2] = (byte)(uVar5 >> 0xc);
            pbVar16[3] = (byte)(uVar5 >> 4);
            pbVar16[4] = bVar3 & 0xf;
            lVar17 = 5;
          }
        }
      }
    }
    pbVar16 = pbVar16 + lVar17;
    if (c->num_landmarks != 0) {
      uVar12 = 0;
      do {
        piVar1 = c->landmark;
        uVar5 = piVar1[uVar12];
        if (uVar5 < 0x80) {
          *pbVar16 = (byte)uVar5;
          lVar17 = 1;
        }
        else if (uVar5 < 0x4000) {
          *pbVar16 = (byte)(uVar5 >> 8) | 0x80;
          pbVar16[1] = *(byte *)(piVar1 + uVar12);
          lVar17 = 2;
        }
        else if (uVar5 < 0x200000) {
          *pbVar16 = (byte)(uVar5 >> 0x10) | 0xc0;
          pbVar16[1] = *(byte *)((long)piVar1 + uVar12 * 4 + 1);
          pbVar16[2] = *(byte *)(c->landmark + uVar12);
          lVar17 = 3;
        }
        else {
          bVar3 = (byte)(uVar5 >> 0x18);
          if (uVar5 < 0x10000000) {
            *pbVar16 = bVar3 | 0xe0;
            pbVar16[1] = *(byte *)((long)piVar1 + uVar12 * 4 + 2);
            pbVar16[2] = *(byte *)((long)c->landmark + uVar12 * 4 + 1);
            pbVar16[3] = *(byte *)(c->landmark + uVar12);
            lVar17 = 4;
          }
          else {
            *pbVar16 = bVar3 >> 4 | 0xf0;
            pbVar16[1] = (byte)((uint)piVar1[uVar12] >> 0x14);
            pbVar16[2] = (byte)((uint)c->landmark[uVar12] >> 0xc);
            pbVar16[3] = (byte)((uint)c->landmark[uVar12] >> 4);
            pbVar16[4] = *(byte *)(c->landmark + uVar12) & 0xf;
            lVar17 = 5;
          }
        }
        pbVar16 = pbVar16 + lVar17;
        uVar12 = uVar12 + 1;
      } while (uVar12 < (uint)c->num_landmarks);
    }
    sVar18 = sVar18 + 4;
    uVar9 = crc32(0,piVar10,(int)pbVar16 - (int)piVar10);
    bVar2 = true;
    if (c->crc32 != uVar9) {
      cram_read_container_cold_1();
      goto LAB_0012a5ed;
    }
  }
  if (!bVar2) {
    return (cram_container *)0x0;
  }
LAB_0012ab85:
  c->offset = sVar18;
  uVar5 = 0;
  c->slices = (cram_slice **)0x0;
  c->curr_slice = 0;
  iVar4 = c->ref_seq_id;
  c->max_slice = c->num_landmarks;
  c->slice_rec = 0;
  c->max_rec = 0;
  c->curr_rec = 0;
  if (iVar4 == -2) {
    c->multi_seq = 1;
    fd->multi_seq = 1;
  }
  if ((iVar4 == -1) && (c->num_records == 0)) {
    uVar5 = (uint)(c->ref_seq_start == 0x454f46);
  }
  fd->empty_container = uVar5;
  return c;
}

Assistant:

cram_container *cram_read_container(cram_fd *fd) {
    cram_container c2, *c;
    int i, s;
    size_t rd = 0;
    
    fd->err = 0;
    fd->eof = 0;

    memset(&c2, 0, sizeof(c2));
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if ((s = itf8_decode(fd, &c2.length)) == -1) {
	    fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    } else {
	if ((s = int32_decode(fd, &c2.length)) == -1) {
	    if (CRAM_MAJOR_VERS(fd->version) == 2 &&
		CRAM_MINOR_VERS(fd->version) == 0)
		fd->eof = 1; // EOF blocks arrived in v2.1
	    else
		fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    }
    if ((s = itf8_decode(fd, &c2.ref_seq_id))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_start))== -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_span)) == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_records))  == -1) return NULL; else rd+=s;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	c2.record_counter = 0;
	c2.num_bases = 0;
    } else {
	if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	    if ((s = ltf8_decode(fd, &c2.record_counter)) == -1)
		return NULL;
	    else
		rd += s;
	} else {
	    int32_t i32;
	    if ((s = itf8_decode(fd, &i32)) == -1)
		return NULL;
	    else
		rd += s;
	    c2.record_counter = i32;
	}

	if ((s = ltf8_decode(fd, &c2.num_bases))== -1)
	    return NULL;
	else
	    rd += s;
    }
    if ((s = itf8_decode(fd, &c2.num_blocks))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_landmarks))== -1) return NULL; else rd+=s;

    if (!(c = calloc(1, sizeof(*c))))
	return NULL;

    *c = c2;

    if (!(c->landmark = malloc(c->num_landmarks * sizeof(int32_t))) &&
	c->num_landmarks) {
	fd->err = errno;
	cram_free_container(c);
	return NULL;
    }  
    for (i = 0; i < c->num_landmarks; i++) {
	if ((s = itf8_decode(fd, &c->landmark[i])) == -1) {
	    cram_free_container(c);
	    return NULL;
	} else {
	    rd += s;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	uint32_t crc, i;
	unsigned char *dat = malloc(50 + 5*(c->num_landmarks)), *cp = dat;
	if (!dat) {
	    cram_free_container(c);
	    return NULL;
	}
	if (-1 == int32_decode(fd, (int32_t *)&c->crc32))
	    return NULL;
	else
	    rd+=4;

	/* Reencode first as we can't easily access the original byte stream.
	 *
	 * FIXME: Technically this means this may not be fool proof. We could
	 * create a CRAM file using a 2 byte ITF8 value that can fit in a 
	 * 1 byte field, meaning the encoding is different to the original
	 * form and so has a different CRC.
	 *
	 * The correct implementation would be to have an alternative form
	 * of itf8_decode which also squirrels away the raw byte stream
	 * during decoding so we can then CRC that.
	 */
	*(unsigned int *)cp = le_int4(c->length); cp += 4;
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
	cp += itf8_put(cp, c->num_records);
	cp += ltf8_put((char *)cp, c->record_counter);
	cp += itf8_put(cp, c->num_bases);
	cp += itf8_put(cp, c->num_blocks);
	cp += itf8_put(cp, c->num_landmarks);
	for (i = 0; i < c->num_landmarks; i++) {
	    cp += itf8_put(cp, c->landmark[i]);
	}

	crc = crc32(0L, dat, cp-dat);
	if (crc != c->crc32) {
	    fprintf(stderr, "Container header CRC32 failure\n");
	    cram_free_container(c);
	    return NULL;
	}
    }

    c->offset = rd;
    c->slices = NULL;
    c->curr_slice = 0;
    c->max_slice = c->num_landmarks;
    c->slice_rec = 0;
    c->curr_rec = 0;
    c->max_rec = 0;

    if (c->ref_seq_id == -2) {
	c->multi_seq = 1;
	fd->multi_seq = 1;
    }

    fd->empty_container =
	(c->num_records == 0 &&
	 c->ref_seq_id == -1 &&
	 c->ref_seq_start == 0x454f46 /* EOF */) ? 1 : 0;

    return c;
}